

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexHashMap.h
# Opt level: O3

void __thiscall
Ptex::v2_2::PtexHashMap<Ptex::v2_2::StringKey,_Ptex::v2_2::PtexCachedReader_*>::initContents
          (PtexHashMap<Ptex::v2_2::StringKey,_Ptex::v2_2::PtexCachedReader_*> *this)

{
  ulong *puVar1;
  long lVar2;
  ulong uVar3;
  
  this->_numEntries = 0x10;
  this->_size = 0;
  uVar3 = (ulong)this->_numEntries;
  puVar1 = (ulong *)operator_new__(uVar3 * 0x20 + 8);
  *puVar1 = uVar3;
  if (uVar3 != 0) {
    lVar2 = 0;
    do {
      *(undefined8 *)((long)puVar1 + lVar2 + 8) = 0;
      *(undefined4 *)((long)puVar1 + lVar2 + 0x10) = 0;
      *(undefined4 *)((long)puVar1 + lVar2 + 0x14) = 0;
      *(undefined1 *)((long)puVar1 + lVar2 + 0x18) = 0;
      *(undefined8 *)((long)puVar1 + lVar2 + 0x20) = 0;
      lVar2 = lVar2 + 0x20;
    } while (uVar3 * 0x20 != lVar2);
  }
  this->_entries = (Entry *)(puVar1 + 1);
  return;
}

Assistant:

void initContents()
    {
        _numEntries = 16;
        _size = 0;
        _entries = new Entry[_numEntries];
    }